

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall
mjs::for_in_statement::for_in_statement
          (for_in_statement *this,source_extend *extend,statement_ptr *init,expression_ptr *e,
          statement_ptr *s)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  pointer psVar4;
  variable_statement *this_00;
  list *this_01;
  size_type sVar5;
  statement_ptr *s_local;
  expression_ptr *e_local;
  statement_ptr *init_local;
  source_extend *extend_local;
  for_in_statement *this_local;
  
  statement::syntax_node(&this->super_statement,extend);
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__for_in_statement_002986b0;
  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::unique_ptr
            (&this->init_,init);
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::unique_ptr(&this->e_,e);
  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::unique_ptr(&this->s_,s);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->init_);
  bVar2 = false;
  if (bVar1) {
    psVar4 = std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator->
                       (&this->init_);
    iVar3 = (*(psVar4->super_syntax_node)._vptr_syntax_node[3])();
    bVar2 = true;
    if (iVar3 != 4) {
      psVar4 = std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator->
                         (&this->init_);
      iVar3 = (*(psVar4->super_syntax_node)._vptr_syntax_node[3])();
      bVar2 = false;
      if (iVar3 == 1) {
        this_00 = (variable_statement *)
                  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator*
                            (&this->init_);
        this_01 = variable_statement::l(this_00);
        sVar5 = std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>::size(this_01);
        bVar2 = sVar5 == 1;
      }
    }
  }
  if (!bVar2) {
    __assert_fail("init_ && (init_->type() == statement_type::expression || (init_->type() == statement_type::variable && static_cast<variable_statement&>(*init_).l().size() == 1))"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x2ca,
                  "mjs::for_in_statement::for_in_statement(const source_extend &, statement_ptr &&, expression_ptr &&, statement_ptr &&)"
                 );
  }
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->e_);
  if (!bVar2) {
    __assert_fail("e_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x2cb,
                  "mjs::for_in_statement::for_in_statement(const source_extend &, statement_ptr &&, expression_ptr &&, statement_ptr &&)"
                 );
  }
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->s_);
  if (bVar2) {
    return;
  }
  __assert_fail("s_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                0x2cc,
                "mjs::for_in_statement::for_in_statement(const source_extend &, statement_ptr &&, expression_ptr &&, statement_ptr &&)"
               );
}

Assistant:

explicit for_in_statement(const source_extend& extend, statement_ptr&& init, expression_ptr&& e, statement_ptr&& s) : statement(extend), init_(std::move(init)), e_(std::move(e)), s_(std::move(s)) {
        assert(init_ && (init_->type() == statement_type::expression || (init_->type() == statement_type::variable && static_cast<variable_statement&>(*init_).l().size() == 1)));
        assert(e_);
        assert(s_);
    }